

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O0

int mtar_file_seek(mtar_t *tar,size_t offset)

{
  int iVar1;
  int iVar2;
  int res;
  size_t offset_local;
  mtar_t *tar_local;
  
  iVar1 = fseeko((FILE *)tar->stream,offset,0);
  iVar2 = -5;
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int mtar_file_seek(mtar_t *tar, size_t offset) {
#if defined(HAVE__FSEEKI64) && (defined(_WIN64) || defined(__x86_64__) || defined(__ppc64__))
  int res = _fseeki64((FILE *)tar->stream, offset, SEEK_SET);
#elif defined(HAVE_FSEEKO) && (defined(_WIN64) || defined(__x86_64__) || defined(__ppc64__))
  int res = fseeko((FILE *)tar->stream, offset, SEEK_SET);
#else
  int res = fseek((FILE *)tar->stream, offset, SEEK_SET);
#endif
  return (res == 0) ? MTAR_ESUCCESS : MTAR_ESEEKFAIL;
}